

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void av1_encode_tile(AV1_COMP *cpi,ThreadData_conflict *td,int tile_row,int tile_col)

{
  int num_planes;
  TileDataEnc *tile_data;
  int in_ECX;
  int in_EDX;
  AV1_COMP *in_RSI;
  MACROBLOCKD *in_RDI;
  AV1_COMMON *unaff_retaddr;
  int mi_row;
  TileInfo *tile_info;
  TileDataEnc *this_tile;
  AV1_COMMON *cm;
  SequenceHeader *in_stack_ffffffffffffffb8;
  CFL_CTX *cfl;
  int local_34;
  TileDataEnc *pTVar1;
  AV1_COMMON *cm_00;
  
  cm_00 = (AV1_COMMON *)(in_RDI[0x10].plane[1].seg_qmatrix[4] + 0xe);
  tile_data = (TileDataEnc *)
              (*(long *)(in_RDI[0x1e].cfl.recon_buf_q3 + 0x250) +
              (long)(in_EDX * *(int *)(in_RDI[0x11].cfl.ac_buf_q3 + 0x31c) + in_ECX) * 0x5d10);
  pTVar1 = tile_data;
  if (*(int *)(in_RDI[0x1a].plane[1].seg_qmatrix[6] + 10) == 0) {
    av1_inter_mode_data_init(tile_data);
  }
  av1_zero_above_context(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX);
  cfl = (CFL_CTX *)&cm_00->above_contexts;
  num_planes = av1_num_planes(cm_00);
  av1_init_above_context
            ((CommonContexts *)cfl,num_planes,in_EDX,
             (MACROBLOCKD *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19));
  if ((*(byte *)((long)in_RDI[0x12].plane[0].seg_iqmatrix[5] + 0x93) & 1) != 0) {
    cfl_init(cfl,in_stack_ffffffffffffffb8);
  }
  if (*(long *)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xd) + 0x10) != 0)
  {
    av1_crc32c_calculator_init
              ((CRC32C *)
               (*(long *)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xd) +
                         0x10) + 0x4248));
  }
  for (local_34 = (tile_data->tile_info).mi_row_start; local_34 < (tile_data->tile_info).mi_row_end;
      local_34 = cm_00->seq_params->mib_size + local_34) {
    av1_encode_sb_row(in_RSI,(ThreadData_conflict *)CONCAT44(in_EDX,in_ECX),
                      (int)((ulong)cm_00 >> 0x20),(int)cm_00,(int)((ulong)pTVar1 >> 0x20));
  }
  pTVar1->abs_sum_level =
       *(uint64_t *)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][1].lps_cost + 7) + 0x58);
  return;
}

Assistant:

void av1_encode_tile(AV1_COMP *cpi, ThreadData *td, int tile_row,
                     int tile_col) {
  AV1_COMMON *const cm = &cpi->common;
  TileDataEnc *const this_tile =
      &cpi->tile_data[tile_row * cm->tiles.cols + tile_col];
  const TileInfo *const tile_info = &this_tile->tile_info;

  if (!cpi->sf.rt_sf.use_nonrd_pick_mode) av1_inter_mode_data_init(this_tile);

  av1_zero_above_context(cm, &td->mb.e_mbd, tile_info->mi_col_start,
                         tile_info->mi_col_end, tile_row);
  av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row,
                         &td->mb.e_mbd);

#if !CONFIG_REALTIME_ONLY
  if (cpi->oxcf.intra_mode_cfg.enable_cfl_intra)
    cfl_init(&td->mb.e_mbd.cfl, cm->seq_params);
#endif

  if (td->mb.txfm_search_info.mb_rd_record != NULL) {
    av1_crc32c_calculator_init(
        &td->mb.txfm_search_info.mb_rd_record->crc_calculator);
  }

  for (int mi_row = tile_info->mi_row_start; mi_row < tile_info->mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    av1_encode_sb_row(cpi, td, tile_row, tile_col, mi_row);
  }
  this_tile->abs_sum_level = td->abs_sum_level;
}